

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O1

bool Js::DateImplementation::TryParseMilliseconds
               (char16 *str,size_t length,size_t startIndex,int *value,size_t *foundDigits)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c1,"(str)","str");
    if (!bVar3) goto LAB_00b4c8d2;
    *puVar4 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c2,"(length)","length");
    if (!bVar3) goto LAB_00b4c8d2;
    *puVar4 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2c3,"(startIndex <= length)","startIndex <= length");
    if (!bVar3) {
LAB_00b4c8d2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar10 = length - startIndex;
  if (uVar10 != 0) {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if (str[startIndex + uVar5] != L'0') break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar10;
    } while (uVar10 != uVar5);
    uVar8 = 0;
    bVar3 = uVar6 < uVar10;
    if (bVar3) {
      uVar7 = str[startIndex + uVar6] + L'￐';
      uVar9 = (uint)uVar7;
      if (9 < uVar7) {
        uVar9 = 0;
      }
      uVar5 = uVar6;
      if (2 < uVar6) {
        uVar9 = 0;
      }
      while (uVar8 = uVar9, uVar6 = uVar5, uVar7 < 10) {
        uVar1 = uVar5 + 1;
        bVar3 = uVar1 < uVar10;
        uVar6 = uVar10;
        if (!bVar3) break;
        uVar7 = str[startIndex + uVar5 + 1] + L'￐';
        uVar9 = (uint)uVar7 + uVar8 * 10;
        if (9 < uVar7) {
          uVar9 = uVar8;
        }
        bVar11 = 1 < uVar5;
        uVar5 = uVar1;
        if (bVar11) {
          uVar9 = uVar8;
        }
      }
    }
    if (uVar6 != 0) {
      *foundDigits = uVar6;
      if (uVar6 == 2) {
        uVar8 = uVar8 * 10;
      }
      else if (uVar6 == 1) {
        uVar8 = uVar8 * 100;
      }
      *value = uVar8;
      if (!bVar3) {
        return true;
      }
      return (ushort)(str[uVar6 + startIndex] + L'ￆ') < 0xfff6;
    }
  }
  return false;
}

Assistant:

bool DateImplementation::TryParseMilliseconds(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        size_t &foundDigits)
    {
        const size_t minNumDigits = 1;

        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        size_t allDigits = length - startIndex;
        if(allDigits < minNumDigits)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < allDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < allDigits ; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            if (i < 3) // not past the 3rd digit in the milliseconds, don't ignore
                v = v * 10 + d;
        }
        if(i < minNumDigits)
            return false;

        foundDigits = i;
        if (foundDigits == 1)
                v = v * 100;
        else if (foundDigits == 2)
                v = v * 10;

        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }